

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.hpp
# Opt level: O2

IntermediateData rest_rpc::MD5::MD5CE::ProcessMessage(char *message,uint32_t n)

{
  uint m;
  uint32_t offset;
  uint i_00;
  uint32_t i;
  uint32_t i_01;
  RoundData data;
  IntermediateData local_98;
  IntermediateData local_88;
  char *local_78;
  RoundData local_70;
  
  m = n + 0x48 & 0xffffffc0;
  local_98.c = 0x98badcfe;
  local_98.d = 0x10325476;
  local_98.a = 0x67452301;
  local_98.b = 0xefcdab89;
  local_78 = message;
  for (i_00 = 0; i_00 < m; i_00 = i_00 + 0x40) {
    GetRoundData(&local_70,local_78,n,m,i_00);
    local_88 = local_98;
    for (i_01 = 0; i_01 != 0x40; i_01 = i_01 + 1) {
      local_88 = ApplyStep(i_01,&local_70,&local_88);
    }
    local_98 = Add(&local_98,&local_88);
  }
  return local_98;
}

Assistant:

static IntermediateData ProcessMessage(const char *message,
                                         const uint32_t n) {
    const uint32_t m = GetPaddedMessageLength(n);
    IntermediateData intermediate0 = kInitialIntermediateData;
    for (uint32_t offset = 0; offset < m; offset += 64) {
      RoundData data = GetRoundData(message, n, m, offset);
      IntermediateData intermediate1 = intermediate0;
      for (uint32_t i = 0; i < 64; ++i)
        intermediate1 = ApplyStep(i, data, intermediate1);
      intermediate0 = Add(intermediate0, intermediate1);
    }
    return intermediate0;
  }